

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O0

void embree::updateEdgeLevelBuffer(ISPCSubdivMesh *mesh,Vec3fa *cam_pos,uint startID,uint endID)

{
  int iVar1;
  uint uVar2;
  uint in_ECX;
  uint in_EDX;
  long in_RDI;
  float fVar3;
  uint i_2;
  uint i_1;
  uint i;
  uint N;
  uint e;
  uint f;
  uint in_stack_00000040;
  uint in_stack_00000044;
  Vec3fa *in_stack_00000048;
  ISPCSubdivMesh *in_stack_00000050;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_1c;
  
  for (local_1c = in_EDX; local_1c < in_ECX; local_1c = local_1c + 1) {
    iVar1 = *(int *)(*(long *)(in_RDI + 0x90) + (ulong)local_1c * 4);
    uVar2 = *(uint *)(*(long *)(in_RDI + 0x58) + (ulong)local_1c * 4);
    if (uVar2 == 4) {
      for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
        fVar3 = updateEdgeLevel(in_stack_00000050,in_stack_00000048,in_stack_00000044,
                                in_stack_00000040);
        *(float *)(*(long *)(in_RDI + 0x68) + (ulong)(iVar1 + local_28) * 4) = fVar3;
      }
    }
    else if (uVar2 == 3) {
      for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
        fVar3 = updateEdgeLevel(in_stack_00000050,in_stack_00000048,in_stack_00000044,
                                in_stack_00000040);
        *(float *)(*(long *)(in_RDI + 0x68) + (ulong)(iVar1 + local_2c) * 4) = fVar3;
      }
    }
    else {
      for (local_30 = 0; local_30 < uVar2; local_30 = local_30 + 1) {
        fVar3 = updateEdgeLevel(in_stack_00000050,in_stack_00000048,in_stack_00000044,
                                in_stack_00000040);
        *(float *)(*(long *)(in_RDI + 0x68) + (ulong)(iVar1 + local_30) * 4) = fVar3;
      }
    }
  }
  return;
}

Assistant:

void updateEdgeLevelBuffer( ISPCSubdivMesh* mesh, const Vec3fa& cam_pos, unsigned int startID, unsigned int endID )
{
  for (unsigned int f=startID; f<endID;f++) {
    unsigned int e = mesh->face_offsets[f];
    unsigned int N = mesh->verticesPerFace[f];
    if (N == 4) /* fast path for quads */
      for (unsigned int i=0; i<4; i++)
        mesh->subdivlevel[e+i] =  updateEdgeLevel(mesh,cam_pos,e+(i+0),e+(i+1)%4);
    else if (N == 3) /* fast path for triangles */
      for (unsigned int i=0; i<3; i++)
        mesh->subdivlevel[e+i] =  updateEdgeLevel(mesh,cam_pos,e+(i+0),e+(i+1)%3);
    else /* fast path for general polygons */
      for (unsigned int i=0; i<N; i++)
        mesh->subdivlevel[e+i] =  updateEdgeLevel(mesh,cam_pos,e+(i+0),e+(i+1)%N);
  }
}